

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

int __thiscall geemuboi::core::CPU::jr_nz_r8(CPU *this)

{
  Registers *pRVar1;
  int iVar2;
  
  pRVar1 = this->regs;
  if (-1 < (char)pRVar1->f) {
    iVar2 = (**this->mmu->_vptr_IMmu)(this->mmu,(ulong)pRVar1->pc);
    this->regs->pc = (short)(char)iVar2 + this->regs->pc + 1;
    return 3;
  }
  pRVar1->pc = pRVar1->pc + 1;
  return 2;
}

Assistant:

int CPU::jr_nz_r8() {
    if (!(regs.f & ICpu::Z_FLAG)) {
        int offset = static_cast<int8_t>(mmu.read_byte(regs.pc)) + 2;
        regs.pc += offset - 1;
        return 3;
    } else {
        regs.pc += 1;
        return 2;
    }
}